

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# benchmark.cpp
# Opt level: O1

string * anon_unknown.dwarf_eb5c::cpputf8_u16_to_u8(string *__return_storage_ptr__,u16string *u16)

{
  __normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
  start;
  
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  __return_storage_ptr__->_M_string_length = 0;
  (__return_storage_ptr__->field_2)._M_local_buf[0] = '\0';
  start._M_current = (u16->_M_dataplus)._M_p;
  utf8::
  utf16to8<__gnu_cxx::__normal_iterator<char16_t_const*,std::__cxx11::u16string>,std::back_insert_iterator<std::__cxx11::string>>
            (start,(__normal_iterator<const_char16_t_*,_std::__cxx11::basic_string<char16_t,_std::char_traits<char16_t>,_std::allocator<char16_t>_>_>
                    )(start._M_current + u16->_M_string_length),
             (back_insert_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )__return_storage_ptr__);
  return __return_storage_ptr__;
}

Assistant:

inline
string cpputf8_u16_to_u8(const u16string& u16)
{
    string u8;
    utf8::utf16to8(std::begin(u16), std::end(u16), std::back_inserter(u8));
    return u8;
}